

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_ins(jit_State *J,BCIns *pc)

{
  int iVar1;
  GCproto *local_20;
  BCIns *pc_local;
  jit_State *J_local;
  
  J->pc = pc;
  J->fn = (GCfunc *)(J->L->base[-2].u64 & 0x7fffffffffff);
  if ((J->fn->c).ffid == '\0') {
    local_20 = (GCproto *)((J->fn->c).pc.ptr64 - 0x68);
  }
  else {
    local_20 = (GCproto *)0x0;
  }
  J->pt = local_20;
  while( true ) {
    iVar1 = lj_vm_cpcall(J->L,0,J,trace_state);
    if (iVar1 == 0) break;
    J->state = LJ_TRACE_ERR;
  }
  return;
}

Assistant:

void lj_trace_ins(jit_State *J, const BCIns *pc)
{
  /* Note: J->L must already be set. pc is the true bytecode PC here. */
  J->pc = pc;
  J->fn = curr_func(J->L);
  J->pt = isluafunc(J->fn) ? funcproto(J->fn) : NULL;
  while (lj_vm_cpcall(J->L, NULL, (void *)J, trace_state) != 0)
    J->state = LJ_TRACE_ERR;
}